

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O1

void mp::WriteVar<fmt::BasicMemoryWriter<char,std::allocator<char>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *pr,char *name,double lb,double ub,
               Type ty)

{
  char *pcVar1;
  size_t __n;
  Buffer<char> *pBVar2;
  ulong uVar3;
  ptrdiff_t _Num;
  char *str;
  size_t sVar4;
  FormatSpec local_48;
  
  pBVar2 = (pr->super_BasicWriter<char>).buffer_;
  uVar3 = pBVar2->size_ + 4;
  if (pBVar2->capacity_ < uVar3) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar3);
  }
  builtin_strncpy(pBVar2->ptr_ + pBVar2->size_,"var ",4);
  pBVar2->size_ = uVar3;
  __n = strlen(name);
  pBVar2 = (pr->super_BasicWriter<char>).buffer_;
  uVar3 = pBVar2->size_ + __n;
  if (pBVar2->capacity_ < uVar3) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar3);
  }
  if (__n != 0) {
    memmove(pBVar2->ptr_ + pBVar2->size_,name,__n);
  }
  pBVar2->size_ = uVar3;
  if (ty == INTEGER && (lb == 0.0 && ub == 1.0)) {
    pBVar2 = (pr->super_BasicWriter<char>).buffer_;
    sVar4 = pBVar2->size_ + 7;
    if (pBVar2->capacity_ < sVar4) {
      (**pBVar2->_vptr_Buffer)(pBVar2,sVar4);
    }
    builtin_strncpy(pBVar2->ptr_ + pBVar2->size_," binary",7);
  }
  else {
    if ((lb == ub) && (!NAN(lb) && !NAN(ub))) {
      pBVar2 = (pr->super_BasicWriter<char>).buffer_;
      uVar3 = pBVar2->size_ + 3;
      if (pBVar2->capacity_ < uVar3) {
        (**pBVar2->_vptr_Buffer)(pBVar2,uVar3);
      }
      pcVar1 = pBVar2->ptr_;
      sVar4 = pBVar2->size_;
      pcVar1[sVar4 + 2] = ' ';
      pcVar1 = pcVar1 + sVar4;
      pcVar1[0] = ' ';
      pcVar1[1] = '=';
      pBVar2->size_ = uVar3;
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(&pr->super_BasicWriter<char>,lb,&local_48);
      return;
    }
    if (-1.79769313486232e+308 < lb) {
      pBVar2 = (pr->super_BasicWriter<char>).buffer_;
      uVar3 = pBVar2->size_ + 3;
      if (pBVar2->capacity_ < uVar3) {
        (**pBVar2->_vptr_Buffer)(pBVar2,uVar3);
      }
      pcVar1 = pBVar2->ptr_;
      sVar4 = pBVar2->size_;
      pcVar1[sVar4 + 2] = '=';
      pcVar1 = pcVar1 + sVar4;
      pcVar1[0] = ' ';
      pcVar1[1] = '>';
      pBVar2->size_ = uVar3;
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(&pr->super_BasicWriter<char>,lb,&local_48);
    }
    if (ub < 1.79769313486232e+308) {
      pBVar2 = (pr->super_BasicWriter<char>).buffer_;
      uVar3 = pBVar2->size_ + 3;
      if (pBVar2->capacity_ < uVar3) {
        (**pBVar2->_vptr_Buffer)(pBVar2,uVar3);
      }
      pcVar1 = pBVar2->ptr_;
      sVar4 = pBVar2->size_;
      pcVar1[sVar4 + 2] = '=';
      pcVar1 = pcVar1 + sVar4;
      pcVar1[0] = ' ';
      pcVar1[1] = '<';
      pBVar2->size_ = uVar3;
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(&pr->super_BasicWriter<char>,ub,&local_48);
    }
    if (ty != INTEGER) {
      return;
    }
    pBVar2 = (pr->super_BasicWriter<char>).buffer_;
    sVar4 = pBVar2->size_ + 8;
    if (pBVar2->capacity_ < sVar4) {
      (**pBVar2->_vptr_Buffer)(pBVar2,sVar4);
    }
    builtin_strncpy(pBVar2->ptr_ + pBVar2->size_," integer",8);
  }
  pBVar2->size_ = sVar4;
  return;
}

Assistant:

void WriteVar(Writer& pr, const char* name,
              double lb, double ub, var::Type ty) {
  assert(*name);
  pr << "var " << name;
  if (!lb && 1.0==ub && var::INTEGER==ty)
    pr << " binary";
  else if (lb==ub)
    pr << " = " << lb;
  else {
    if (lb > -DBL_MAX)
    pr << " >=" << lb;
    if (ub < DBL_MAX)
    pr << " <=" << ub;
    if (var::INTEGER == ty)
    pr << " integer";
  }
}